

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ca709::ThrowingElement::operator<(ThrowingElement *this,ThrowingElement *rhs)

{
  runtime_error *this_00;
  ThrowingElement *rhs_local;
  ThrowingElement *this_local;
  
  (anonymous_namespace)::ThrowingElement::throw_on_compare =
       (anonymous_namespace)::ThrowingElement::throw_on_compare + -1;
  if ((anonymous_namespace)::ThrowingElement::throw_on_compare == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Comparison exception.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this->value < rhs->value;
}

Assistant:

bool operator< (ThrowingElement const & rhs) const
  {
    if (--throw_on_compare == 0)
      throw std::runtime_error("Comparison exception.");
    return value < rhs.value;
  }